

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::CreateSecondaryAllocator
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,
          SegmentBase<Memory::VirtualAllocWrapper> *segment,bool committed,
          SecondaryAllocator **allocator)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *pHVar4;
  VirtualAllocWrapper *this_00;
  char *pcVar5;
  LPVOID pvVar6;
  HeapAllocator *alloc;
  XDataAllocator *this_01;
  BYTE *address;
  char *segmentEnd;
  undefined8 *in_FS_OFFSET;
  bool local_71;
  bool success;
  TrackAllocData local_60;
  XDataAllocator *local_38;
  XDataAllocator *secondaryAllocator;
  SecondaryAllocator **allocator_local;
  SegmentBase<Memory::VirtualAllocWrapper> *pSStack_20;
  bool committed_local;
  SegmentBase<Memory::VirtualAllocWrapper> *segment_local;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_local;
  
  secondaryAllocator = (XDataAllocator *)allocator;
  allocator_local._7_1_ = committed;
  pSStack_20 = segment;
  segment_local = (SegmentBase<Memory::VirtualAllocWrapper> *)this;
  pHVar4 = (HeapPageAllocator<Memory::VirtualAllocWrapper> *)
           SegmentBase<Memory::VirtualAllocWrapper>::GetAllocator(segment);
  if (pHVar4 != this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xb34,"(segment->GetAllocator() == this)","segment->GetAllocator() == this")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  bVar2 = SegmentBase<Memory::VirtualAllocWrapper>::IsInCustomHeapAllocator(pSStack_20);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xb35,"(segment->IsInCustomHeapAllocator())",
                       "segment->IsInCustomHeapAllocator()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if ((this->allocXdata & 1U) == 0) {
    uVar3 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocSize(pSStack_20);
    if (uVar3 != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *(undefined4 *)*in_FS_OFFSET = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xb3c,"(segment->GetSecondaryAllocSize() == 0)",
                         "segment->GetSecondaryAllocSize() == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *(undefined4 *)*in_FS_OFFSET = 0;
    }
    (secondaryAllocator->super_SecondaryAllocator)._vptr_SecondaryAllocator = (_func_int **)0x0;
    this_local._7_1_ = true;
  }
  else {
    if (((allocator_local._7_1_ & 1) == 0) &&
       (uVar3 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocSize(pSStack_20),
       uVar3 != 0)) {
      this_00 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                ::GetVirtualAllocator
                          (&this->
                            super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                          );
      pcVar5 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocStartAddress(pSStack_20);
      uVar3 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocPageCount(pSStack_20);
      pvVar6 = VirtualAllocWrapper::AllocPages(this_00,pcVar5,(ulong)uVar3,0x1000,4,true);
      if (pvVar6 == (LPVOID)0x0) {
        (secondaryAllocator->super_SecondaryAllocator)._vptr_SecondaryAllocator = (_func_int **)0x0;
        return false;
      }
    }
    TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&XDataAllocator::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
               ,0xb48);
    alloc = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,&local_60);
    this_01 = (XDataAllocator *)new<Memory::HeapAllocator>(0x28,alloc,true,0x28d090);
    address = (BYTE *)SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocStartAddress
                                (pSStack_20);
    uVar3 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocSize(pSStack_20);
    XDataAllocator::XDataAllocator(this_01,address,uVar3);
    local_71 = false;
    local_38 = this_01;
    if (this_01 != (XDataAllocator *)0x0) {
      pcVar5 = SegmentBase<Memory::VirtualAllocWrapper>::GetAddress(pSStack_20);
      segmentEnd = SegmentBase<Memory::VirtualAllocWrapper>::GetEndAddress(pSStack_20);
      local_71 = XDataAllocator::Initialize(this_01,pcVar5,segmentEnd);
      if (!local_71) {
        DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::XDataAllocator>
                  (&HeapAllocator::Instance,local_38);
        local_38 = (XDataAllocator *)0x0;
      }
    }
    (secondaryAllocator->super_SecondaryAllocator)._vptr_SecondaryAllocator = (_func_int **)local_38
    ;
    this_local._7_1_ = local_71;
  }
  return this_local._7_1_;
}

Assistant:

bool HeapPageAllocator<T>::CreateSecondaryAllocator(SegmentBase<T>* segment, bool committed, SecondaryAllocator** allocator)
{
    Assert(segment->GetAllocator() == this);
    Assert(segment->IsInCustomHeapAllocator());

    // If we are not allocating xdata there is nothing to do

    // ARM might allocate XDATA but not have a reserved region for it (no secondary alloc reserved space)
    if (!allocXdata)
    {
        Assert(segment->GetSecondaryAllocSize() == 0);
        *allocator = nullptr;
        return true;
    }

    if (!committed && segment->GetSecondaryAllocSize() != 0 &&
        !this->GetVirtualAllocator()->AllocPages(segment->GetSecondaryAllocStartAddress(), segment->GetSecondaryAllocPageCount(), MEM_COMMIT, PAGE_READWRITE, true))
    {
        *allocator = nullptr;
        return false;
    }

    XDataAllocator* secondaryAllocator = HeapNewNoThrow(XDataAllocator, (BYTE*)segment->GetSecondaryAllocStartAddress(), segment->GetSecondaryAllocSize());
    bool success = false;
    if (secondaryAllocator)
    {
        if (secondaryAllocator->Initialize((BYTE*)segment->GetAddress(), (BYTE*)segment->GetEndAddress()))
        {
            success = true;
        }
        else
        {
            HeapDelete(secondaryAllocator);
            secondaryAllocator = nullptr;
        }
    }
    *allocator = secondaryAllocator;
    return success;
}